

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

Value * __thiscall json::Value::setObject(Value *this)

{
  unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
  *this_00;
  void *in_RSI;
  Value *this_local;
  
  free(this,in_RSI);
  this->type = Object;
  this_00 = (unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
             *)operator_new(0x38);
  memset(this_00,0,0x38);
  std::
  unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
  ::unordered_map(this_00);
  (this->field_1).arr = (ArrayStorage *)this_00;
  return this;
}

Assistant:

Value& setObject() {
    free();
    type = Object;
    obj = new ObjectStorage();
    return *this;
  }